

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

int32_t binarySearch(CurrencyNameStruct *currencyNames,int32_t indexInCurrencyNames,UChar key,
                    int32_t *begin,int32_t *end)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  int32_t M_1;
  int32_t M;
  int32_t R;
  int32_t L;
  int32_t mid;
  int32_t last;
  int32_t first;
  int32_t *end_local;
  int32_t *begin_local;
  UChar key_local;
  int32_t indexInCurrencyNames_local;
  CurrencyNameStruct *currencyNames_local;
  
  mid = *begin;
  L = *end;
  while( true ) {
    while( true ) {
      while( true ) {
        if (L < mid) {
          *begin = -1;
          *end = -1;
          return -1;
        }
        iVar1 = (mid + L) / 2;
        if (indexInCurrencyNames < currencyNames[iVar1].currencyNameLen) break;
        mid = iVar1 + 1;
      }
      if ((ushort)key <= (ushort)currencyNames[iVar1].currencyName[indexInCurrencyNames]) break;
      mid = iVar1 + 1;
    }
    if ((ushort)currencyNames[iVar1].currencyName[indexInCurrencyNames] <= (ushort)key) break;
    L = iVar1 + -1;
  }
  M = *begin;
  iVar2 = iVar1;
  while (M_1 = iVar2, M < M_1) {
    iVar2 = (M + M_1) / 2;
    if (indexInCurrencyNames < currencyNames[iVar2].currencyNameLen) {
      if ((ushort)currencyNames[iVar2].currencyName[indexInCurrencyNames] < (ushort)key) {
        M = iVar2 + 1;
        iVar2 = M_1;
      }
    }
    else {
      M = iVar2 + 1;
      iVar2 = M_1;
    }
  }
  *begin = M;
  iVar3 = *end;
  M = iVar1;
  while (M_1 = iVar3, M < M_1) {
    iVar3 = (M + M_1) / 2;
    if (currencyNames[iVar3].currencyNameLen < indexInCurrencyNames) {
      M = iVar3 + 1;
      iVar3 = M_1;
    }
    else if ((ushort)currencyNames[iVar3].currencyName[indexInCurrencyNames] <= (ushort)key) {
      M = iVar3 + 1;
      iVar3 = M_1;
    }
  }
  if ((ushort)key < (ushort)currencyNames[M_1].currencyName[indexInCurrencyNames]) {
    *end = M_1 + -1;
  }
  else {
    *end = M_1;
  }
  if (currencyNames[*begin].currencyNameLen == indexInCurrencyNames + 1) {
    return *begin;
  }
  return -1;
}

Assistant:

static int32_t
binarySearch(const CurrencyNameStruct* currencyNames, 
             int32_t indexInCurrencyNames,
             const UChar key,
             int32_t* begin, int32_t* end) {
#ifdef UCURR_DEBUG
    printf("key = %x\n", key);
#endif
   int32_t first = *begin;
   int32_t last = *end;
   while (first <= last) {
       int32_t mid = (first + last) / 2;  // compute mid point.
       if (indexInCurrencyNames >= currencyNames[mid].currencyNameLen) {
           first = mid + 1;
       } else {
           if (key > currencyNames[mid].currencyName[indexInCurrencyNames]) {
               first = mid + 1;
           }
           else if (key < currencyNames[mid].currencyName[indexInCurrencyNames]) {
               last = mid - 1;
           }
           else {
                // Find a match, and looking for ranges
                // Now do two more binary searches. First, on the left side for
                // the greatest L such that CurrencyNameStruct[L] < key.
                int32_t L = *begin;
                int32_t R = mid;

#ifdef UCURR_DEBUG
                printf("mid = %d\n", mid);
#endif
                while (L < R) {
                    int32_t M = (L + R) / 2;
#ifdef UCURR_DEBUG
                    printf("L = %d, R = %d, M = %d\n", L, R, M);
#endif
                    if (indexInCurrencyNames >= currencyNames[M].currencyNameLen) {
                        L = M + 1;
                    } else {
                        if (currencyNames[M].currencyName[indexInCurrencyNames] < key) {
                            L = M + 1;
                        } else {
#ifdef UCURR_DEBUG
                            U_ASSERT(currencyNames[M].currencyName[indexInCurrencyNames] == key);
#endif
                            R = M;
                        }
                    }
                }
#ifdef UCURR_DEBUG
                U_ASSERT(L == R);
#endif
                *begin = L;
#ifdef UCURR_DEBUG
                printf("begin = %d\n", *begin);
                U_ASSERT(currencyNames[*begin].currencyName[indexInCurrencyNames] == key);
#endif

                // Now for the second search, finding the least R such that
                // key < CurrencyNameStruct[R].
                L = mid;
                R = *end;
                while (L < R) {
                    int32_t M = (L + R) / 2;
#ifdef UCURR_DEBUG
                    printf("L = %d, R = %d, M = %d\n", L, R, M);
#endif
                    if (currencyNames[M].currencyNameLen < indexInCurrencyNames) {
                        L = M + 1;
                    } else {
                        if (currencyNames[M].currencyName[indexInCurrencyNames] > key) {
                            R = M;
                        } else {
#ifdef UCURR_DEBUG
                            U_ASSERT(currencyNames[M].currencyName[indexInCurrencyNames] == key);
#endif
                            L = M + 1;
                        }
                    }
                }
#ifdef UCURR_DEBUG
                U_ASSERT(L == R);
#endif
                if (currencyNames[R].currencyName[indexInCurrencyNames] > key) {
                    *end = R - 1;
                } else {
                    *end = R;
                }
#ifdef UCURR_DEBUG
                printf("end = %d\n", *end);
#endif

                // now, found the range. check whether there is exact match
                if (currencyNames[*begin].currencyNameLen == indexInCurrencyNames + 1) {
                    return *begin;  // find range and exact match.
                }
                return -1;  // find range, but no exact match.
           }
       }
   }
   *begin = -1;
   *end = -1;
   return -1;    // failed to find range.
}